

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

char * slurpfile(size_t *sizep,char *fmt,...)

{
  char in_AL;
  int __fd;
  char *__ptr;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  size_t *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  wchar_t r;
  FILE *f;
  ssize_t bytes_read;
  char *p;
  va_list ap;
  stat st;
  char filename [8192];
  undefined1 auStackY_2198 [16];
  undefined8 local_2188;
  undefined8 local_2180;
  undefined8 local_2178;
  undefined8 local_2170;
  undefined8 local_2168;
  undefined8 local_2158;
  undefined8 local_2148;
  undefined8 local_2138;
  undefined8 local_2128;
  undefined8 local_2118;
  undefined8 local_2108;
  undefined8 local_20f8;
  int local_20e4;
  FILE *local_20e0;
  size_t local_20d8;
  undefined4 local_20c8;
  undefined4 local_20c4;
  undefined1 *local_20c0;
  undefined1 *local_20b8;
  stat local_20a8;
  char local_2018 [8192];
  char *local_18;
  size_t *local_10;
  char *local_8;
  
  local_20b8 = auStackY_2198;
  if (in_AL != '\0') {
    local_2168 = in_XMM0_Qa;
    local_2158 = in_XMM1_Qa;
    local_2148 = in_XMM2_Qa;
    local_2138 = in_XMM3_Qa;
    local_2128 = in_XMM4_Qa;
    local_2118 = in_XMM5_Qa;
    local_2108 = in_XMM6_Qa;
    local_20f8 = in_XMM7_Qa;
  }
  local_20c0 = &stack0x00000008;
  local_20c4 = 0x30;
  local_20c8 = 0x10;
  local_2188 = in_RDX;
  local_2180 = in_RCX;
  local_2178 = in_R8;
  local_2170 = in_R9;
  local_18 = in_RSI;
  local_10 = in_RDI;
  vsprintf(local_2018,in_RSI,&local_20c8);
  local_20e0 = fopen(local_2018,"rb");
  if (local_20e0 == (FILE *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    __fd = fileno(local_20e0);
    local_20e4 = fstat(__fd,&local_20a8);
    if (local_20e4 == 0) {
      __ptr = (char *)malloc(local_20a8.st_size + 1);
      if (__ptr == (char *)0x0) {
        logprintf("Can\'t allocate %ld bytes of memory to read file %s\n",local_20a8.st_size,
                  local_2018);
        fclose(local_20e0);
        local_8 = (char *)0x0;
      }
      else {
        local_20d8 = fread(__ptr,1,local_20a8.st_size,local_20e0);
        if ((long)local_20d8 < local_20a8.st_size) {
          logprintf("Can\'t read file %s\n",local_2018);
          fclose(local_20e0);
          free(__ptr);
          local_8 = (char *)0x0;
        }
        else {
          __ptr[local_20a8.st_size] = '\0';
          if (local_10 != (size_t *)0x0) {
            *local_10 = local_20a8.st_size;
          }
          fclose(local_20e0);
          local_8 = __ptr;
        }
      }
    }
    else {
      logprintf("Can\'t stat file %s\n",local_2018);
      fclose(local_20e0);
      local_8 = (char *)0x0;
    }
  }
  return local_8;
}

Assistant:

char *
slurpfile(size_t * sizep, const char *fmt, ...)
{
	char filename[8192];
	struct stat st;
	va_list ap;
	char *p;
	ssize_t bytes_read;
	FILE *f;
	int r;

	va_start(ap, fmt);
	vsprintf(filename, fmt, ap);
	va_end(ap);

	f = fopen(filename, "rb");
	if (f == NULL) {
		/* Note: No error; non-existent file is okay here. */
		return (NULL);
	}
	r = fstat(fileno(f), &st);
	if (r != 0) {
		logprintf("Can't stat file %s\n", filename);
		fclose(f);
		return (NULL);
	}
	p = malloc((size_t)st.st_size + 1);
	if (p == NULL) {
		logprintf("Can't allocate %ld bytes of memory to read file %s\n",
		    (long int)st.st_size, filename);
		fclose(f);
		return (NULL);
	}
	bytes_read = fread(p, 1, (size_t)st.st_size, f);
	if (bytes_read < st.st_size) {
		logprintf("Can't read file %s\n", filename);
		fclose(f);
		free(p);
		return (NULL);
	}
	p[st.st_size] = '\0';
	if (sizep != NULL)
		*sizep = (size_t)st.st_size;
	fclose(f);
	return (p);
}